

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall S2Polygon::InitToCellUnionBorder(S2Polygon *this,S2CellUnion *cells)

{
  pointer pSVar1;
  S2Polygon *this_00;
  bool bVar2;
  uint64 uVar3;
  ostream *os;
  pointer pSVar4;
  double dVar5;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_360;
  S2Polygon *local_358;
  undefined1 local_350 [56];
  S2Error error;
  S2Builder builder;
  
  dVar5 = S2::Metric<1>::GetValue((Metric<1> *)&S2::kMinWidth,0x1e);
  s2builderutil::IdentitySnapFunction::IdentitySnapFunction
            ((IdentitySnapFunction *)local_350,(S1Angle)(dVar5 * 0.5));
  S2Builder::Options::Options((Options *)&error,(SnapFunction *)local_350);
  S2Builder::S2Builder(&builder,(Options *)&error);
  if (error._0_8_ != 0) {
    (**(code **)(*(long *)error._0_8_ + 8))();
  }
  local_350._0_8_ = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>
            ((absl *)&error,(S2Polygon **)local_350);
  local_360._M_head_impl = (Layer *)error._0_8_;
  error.code_ = OK;
  error._4_4_ = 0;
  S2Builder::StartLayer
            (&builder,(unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)
                      &local_360);
  if (local_360._M_head_impl != (Layer *)0x0) {
    (*(local_360._M_head_impl)->_vptr_Layer[1])();
  }
  local_360._M_head_impl = (Layer *)0x0;
  local_358 = this;
  if (error._0_8_ != 0) {
    (**(code **)(*(long *)error._0_8_ + 8))();
  }
  pSVar1 = (cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar4 = (cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    S2Cell::S2Cell((S2Cell *)local_350,(S2CellId)pSVar4->id_);
    S2Loop::S2Loop((S2Loop *)&error,(S2Cell *)local_350);
    S2Builder::AddLoop(&builder,(S2Loop *)&error);
    S2Loop::~S2Loop((S2Loop *)&error);
  }
  error._0_8_ = error._0_8_ & 0xffffffff00000000;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  bVar2 = S2Builder::Build(&builder,&error);
  this_00 = local_358;
  if (bVar2) {
    if (((int)((ulong)((long)(local_358->loops_).
                             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_358->loops_).
                            super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) &&
       ((cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (cells->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      uVar3 = S2CellUnion::LeafCellsCovered(cells);
      if (uVar3 != 0x6000000000000000) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)local_350,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x51b,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)local_350._8_8_,
                        "Check failed: (uint64{6} << (2 * S2CellId::kMaxLevel)) == (cells.LeafCellsCovered()) "
                       );
        goto LAB_0024793e;
      }
      Invert(this_00);
    }
    std::__cxx11::string::~string((string *)&error.text_);
    S2Builder::~S2Builder(&builder);
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)local_350,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x513,kFatal,(ostream *)&std::cerr);
  os = std::operator<<((ostream *)local_350._8_8_,"InitToCellUnionBorder failed: ");
  ::operator<<(os,&error);
LAB_0024793e:
  abort();
}

Assistant:

void S2Polygon::InitToCellUnionBorder(const S2CellUnion& cells) {
  // We use S2Builder to compute the union.  Due to rounding errors, we can't
  // compute an exact union - when a small cell is adjacent to a larger cell,
  // the shared edges can fail to line up exactly.  Two cell edges cannot come
  // closer then kMinWidth, so if we have S2Builder snap edges within half
  // that distance, then we should always merge shared edges without merging
  // different edges.
  double snap_radius = 0.5 * S2::kMinWidth.GetValue(S2CellId::kMaxLevel);
  S2Builder builder{S2Builder::Options(
      IdentitySnapFunction(S1Angle::Radians(snap_radius)))};
  builder.StartLayer(make_unique<S2PolygonLayer>(this));
  for (S2CellId id : cells) {
    builder.AddLoop(S2Loop{S2Cell{id}});
  }
  S2Error error;
  if (!builder.Build(&error)) {
    S2_LOG(DFATAL) << "InitToCellUnionBorder failed: " << error;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  There are only two ways that this can
  // happen: either the cell union is empty, or it consists of all six faces.
  if (num_loops() == 0) {
    if (cells.empty()) return;
    S2_DCHECK_EQ(uint64{6} << (2 * S2CellId::kMaxLevel),
              cells.LeafCellsCovered());
    Invert();
  }
}